

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O2

void __thiscall
Function_Pool::FunctionPoolTask::_setup
          (FunctionPoolTask *this,Image *in,uint32_t inX,uint32_t inY,Image *out,uint32_t outX,
          uint32_t outY,uint32_t width,uint32_t height)

{
  bool bVar1;
  uint32_t uVar2;
  pointer __p_00;
  pointer __p_01;
  imageException *this_00;
  pointer __p;
  pointer __p_1;
  __uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
  local_38;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,inX,inY,out,outX,outY,width,height);
  bVar1 = AbstractTaskProvider::_ready((AbstractTaskProvider *)this);
  if (bVar1) {
    __p_00 = (pointer)operator_new(0x68);
    uVar2 = anon_unknown.dwarf_42020::threadCount();
    AreaInfo::AreaInfo((AreaInfo *)__p_00,inX,inY,width,height,uVar2);
    __p_00->image = in;
    local_38._M_t.
    super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
    .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl =
         (tuple<Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
          )(_Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
            )0x0;
    std::
    __uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
    ::reset((__uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             *)&this->_infoIn1,__p_00);
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    ~unique_ptr((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                 *)&local_38);
    __p_01 = (pointer)operator_new(0x68);
    uVar2 = anon_unknown.dwarf_42020::threadCount();
    AreaInfo::AreaInfo((AreaInfo *)__p_01,outX,outY,width,height,uVar2);
    local_38._M_t.
    super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
    .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl =
         (tuple<Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
          )(_Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
            )0x0;
    __p_01->image = out;
    std::
    __uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::reset((__uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             *)&this->_infoOut,__p_01);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::~unique_ptr((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                   *)&local_38);
    return;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,"FunctionTask object was called multiple times!");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void FunctionPoolTask::_setup( const Image & in, uint32_t inX, uint32_t inY, Image & out, uint32_t outX, uint32_t outY, uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( in, inX, inY, out, outX, outY, width, height );

        if( !_ready() )
            throw imageException( "FunctionTask object was called multiple times!" );

        _infoIn1 = std::unique_ptr < InputImageInfo  >( new InputImageInfo ( in, inX, inY, width, height, threadCount() ) );
        _infoOut = std::unique_ptr < OutputImageInfo >( new OutputImageInfo( out, outX, outY, width, height, threadCount() ) );
    }